

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_UsecaseMultisig_Test::TestBody(Psbt_UsecaseMultisig_Test *this)

{
  allocator<cfd::core::Pubkey> *paVar1;
  allocator<cfd::core::ByteData> *this_00;
  initializer_list<cfd::core::ByteData> __l;
  initializer_list<cfd::core::KeyData> __l_00;
  initializer_list<cfd::core::Pubkey> __l_01;
  initializer_list<cfd::core::Pubkey> __l_02;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  Amount *value;
  Amount AVar6;
  ByteData *local_1d98;
  KeyData *local_1c20;
  Pubkey *local_1b60;
  Pubkey *local_1b38;
  AssertionResult gtest_ar_24;
  CfdException *except_9;
  Message local_1af0;
  string local_1ae8;
  undefined1 local_1ac8 [8];
  AssertionResult gtest_ar_23;
  Transaction tx_1;
  AssertHelper local_1a58;
  Message local_1a50;
  bool local_1a41;
  undefined1 local_1a40 [8];
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_22;
  CfdException *except_8;
  Message local_1a00;
  string local_19f8;
  undefined1 local_19d8 [8];
  AssertionResult gtest_ar_21;
  Message local_19c0;
  string local_19b8;
  ByteData local_1998;
  ByteData local_1980;
  string local_1968;
  undefined1 local_1948 [8];
  AssertionResult gtest_ar_20;
  Script exp_script;
  Message local_18f8;
  size_type local_18f0;
  int local_18e4;
  undefined1 local_18e0 [8];
  AssertionResult gtest_ar_19;
  Message local_18c8;
  string local_18c0;
  string local_18a0;
  undefined1 local_1880 [8];
  AssertionResult gtest_ar_18;
  Message local_1868;
  size_type local_1860;
  int local_1854;
  undefined1 local_1850 [8];
  AssertionResult gtest_ar_17;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> wsh_script;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> wit_script;
  AssertHelper local_17f0;
  Message local_17e8;
  bool local_17d9;
  undefined1 local_17d8 [8];
  AssertionResult gtest_ar__2;
  ByteData local_17b8;
  ByteData local_17a0;
  ByteData local_1788;
  ByteData local_1770;
  undefined1 local_1758 [40];
  string local_1730;
  AssertHelper local_1710;
  Message local_1708;
  bool local_16f9;
  undefined1 local_16f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_16c8;
  Message local_16c0;
  bool local_16b1;
  undefined1 local_16b0 [8];
  AssertionResult gtest_ar_;
  Script script;
  undefined1 local_1650 [8];
  ByteData sig2;
  undefined1 local_1620 [8];
  ByteData sig1;
  AssertionResult gtest_ar_16;
  CfdException *except_7;
  Message local_15d8;
  string local_15d0;
  undefined1 local_15b0 [8];
  AssertionResult gtest_ar_15;
  Message local_1598;
  ByteData local_1590;
  string local_1578;
  undefined1 local_1558 [8];
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  CfdException *except_6;
  Privkey local_1508;
  undefined1 local_14e8 [8];
  ByteData sig;
  Amount local_14c0;
  SigHashType local_14ac;
  Script local_14a0;
  ByteData local_1468;
  undefined1 local_1450 [8];
  ByteData256 sighash;
  Transaction tx;
  TxOut utxo_txout;
  SigHashType sighash_type;
  AssertionResult gtest_ar_12;
  CfdException *except_5;
  AssertionResult gtest_ar_11;
  CfdException *except_4;
  Message local_1320;
  string local_1318;
  undefined1 local_12f8 [8];
  AssertionResult gtest_ar_10;
  Message local_12e0;
  ByteData local_12d8;
  string local_12c0;
  undefined1 local_12a0 [8];
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  CfdException *except_3;
  Message local_1260;
  string local_1258;
  undefined1 local_1238 [8];
  AssertionResult gtest_ar_7;
  undefined1 local_11d8 [8];
  Psbt psbt2;
  AssertionResult gtest_ar_6;
  CfdException *except_2;
  Message local_1158;
  string local_1150;
  undefined1 local_1130 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_10d0 [8];
  Psbt psbt1;
  AssertionResult gtest_ar_4;
  CfdException *except_1;
  KeyData *local_1050;
  KeyData local_1048;
  KeyData local_ef8;
  undefined1 local_da8 [96];
  undefined1 local_d48 [8];
  Amount amount;
  AssertionResult gtest_ar_3;
  CfdException *except;
  Message local_d08;
  Script local_d00;
  string local_cc8;
  undefined1 local_ca8 [8];
  AssertionResult gtest_ar_2;
  Message local_c90;
  Script local_c88;
  string local_c50;
  undefined1 local_c30 [8];
  AssertionResult gtest_ar_1;
  KeyData local_c10;
  TxOutReference local_ac0;
  allocator local_a69;
  string local_a68;
  Txid local_a48;
  undefined1 local_a28 [8];
  TxIn txin;
  Transaction utxo_tx;
  Message local_950;
  string local_948;
  undefined1 local_928 [8];
  AssertionResult gtest_ar;
  Pubkey local_908;
  Pubkey local_8f0;
  undefined1 local_8d8 [40];
  undefined1 local_8b0 [8];
  Script multisig;
  KeyData key_in2;
  KeyData key_in1;
  undefined1 local_5d0 [8];
  string in_path;
  Address addr;
  Pubkey local_428;
  Pubkey local_410;
  undefined1 local_3f8 [40];
  undefined1 local_3d0 [8];
  Script out_multisig;
  KeyData key2;
  KeyData key1;
  undefined1 local_f0 [8];
  string path1;
  undefined1 local_b8 [8];
  HDWallet wallet2;
  ByteData local_90;
  undefined1 local_78 [8];
  HDWallet wallet1;
  Psbt psbt;
  Psbt_UsecaseMultisig_Test *this_local;
  
  cfd::core::Psbt::Psbt
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData(&local_90,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_78,&local_90);
  cfd::core::ByteData::~ByteData(&local_90);
  cfd::core::ByteData::ByteData((ByteData *)((long)&path1.field_2 + 8),&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_b8,(ByteData *)((long)&path1.field_2 + 8));
  cfd::core::ByteData::~ByteData((ByteData *)((long)&path1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_f0,"44h/0h/0h/0/12",
             (allocator *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_78,kTestnet,
             (string *)local_f0);
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &out_multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_b8,kTestnet,
             (string *)local_f0);
  cfd::core::KeyData::GetPubkey
            (&local_428,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetPubkey
            (&local_410,
             (KeyData *)
             &out_multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_3f8._0_8_ = &local_428;
  local_3f8._8_8_ = (pointer)0x2;
  paVar1 = (allocator<cfd::core::Pubkey> *)
           ((long)&addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
  std::allocator<cfd::core::Pubkey>::allocator(paVar1);
  __l_02._M_len = local_3f8._8_8_;
  __l_02._M_array = (iterator)local_3f8._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_3f8 + 0x10),
             __l_02,paVar1);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((Script *)local_3d0,2,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_3f8 + 0x10),
             true);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_3f8 + 0x10));
  std::allocator<cfd::core::Pubkey>::~allocator
            ((allocator<cfd::core::Pubkey> *)
             ((long)&addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_1b38 = (Pubkey *)local_3f8;
  do {
    local_1b38 = local_1b38 + -1;
    cfd::core::Pubkey::~Pubkey(local_1b38);
  } while (local_1b38 != &local_428);
  cfd::core::Address::Address
            ((Address *)((long)&in_path.field_2 + 8),kCfdIllegalArgumentError,kVersion0,
             (Script *)local_3d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_5d0,"44h/0h/0h/0/11",
             (allocator *)
             ((long)&key_in1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key_in1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::HDWallet::GeneratePrivkeyData
            ((KeyData *)
             &key_in2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_78,kTestnet,
             (string *)local_5d0);
  cfd::core::HDWallet::GeneratePrivkeyData
            ((KeyData *)
             &multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_b8,kTestnet,
             (string *)local_5d0);
  cfd::core::KeyData::GetPubkey
            (&local_908,
             (KeyData *)
             &key_in2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetPubkey
            (&local_8f0,
             (KeyData *)
             &multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_8d8._0_8_ = &local_908;
  local_8d8._8_8_ = (pointer)0x2;
  paVar1 = (allocator<cfd::core::Pubkey> *)((long)&gtest_ar.message_.ptr_ + 7);
  std::allocator<cfd::core::Pubkey>::allocator(paVar1);
  __l_01._M_len = local_8d8._8_8_;
  __l_01._M_array = (iterator)local_8d8._0_8_;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_8d8 + 0x10),
             __l_01,paVar1);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((Script *)local_8b0,2,
             (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_8d8 + 0x10),
             true);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_8d8 + 0x10));
  std::allocator<cfd::core::Pubkey>::~allocator
            ((allocator<cfd::core::Pubkey> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_1b60 = (Pubkey *)local_8d8;
  do {
    local_1b60 = local_1b60 + -1;
    cfd::core::Pubkey::~Pubkey(local_1b60);
  } while (local_1b60 != &local_908);
  cfd::core::Script::GetHex_abi_cxx11_(&local_948,(Script *)local_8b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_928,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"multisig.GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_948);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_928);
  if (!bVar2) {
    testing::Message::Message(&local_950);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_928);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &utxo_tx.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x30d,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &utxo_tx.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_950);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &utxo_tx.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_928);
  cfd::core::Transaction::Transaction
            ((Transaction *)
             ((long)&txin.super_AbstractTxIn.script_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data + 0x10),&g_psbt_utxo_sh_wsh_multi_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a68,"544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"
             ,&local_a69);
  cfd::core::Txid::Txid(&local_a48,&local_a68);
  cfd::core::TxIn::TxIn((TxIn *)local_a28,&local_a48,0,0xffffffff);
  cfd::core::Txid::~Txid(&local_a48);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a69);
  cfd::core::Psbt::AddTxIn
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(TxIn *)local_a28);
  cfd::core::Transaction::GetTxOut
            (&local_ac0,
             (Transaction *)
             ((long)&txin.super_AbstractTxIn.script_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data + 0x10),0);
  cfd::core::KeyData::KeyData(&local_c10);
  cfd::core::Psbt::SetTxInUtxo
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,&local_ac0,(Script *)local_8b0,
             &local_c10);
  cfd::core::KeyData::~KeyData(&local_c10);
  cfd::core::TxOutReference::~TxOutReference(&local_ac0);
  cfd::core::SigHashType::SigHashType((SigHashType *)((long)&gtest_ar_1.message_.ptr_ + 4));
  cfd::core::Psbt::SetTxInSighashType
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,
             (SigHashType *)((long)&gtest_ar_1.message_.ptr_ + 4));
  cfd::core::Psbt::GetTxInRedeemScriptDirect
            (&local_c88,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,true,true);
  cfd::core::Script::GetHex_abi_cxx11_(&local_c50,&local_c88);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c30,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_c50);
  cfd::core::Script::~Script(&local_c88);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c30);
  if (!bVar2) {
    testing::Message::Message(&local_c90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x317,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c30);
  cfd::core::Psbt::GetTxInRedeemScriptDirect
            (&local_d00,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,true,false);
  cfd::core::Script::GetHex_abi_cxx11_(&local_cc8,&local_d00);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ca8,
             "\"00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9\"",
             "psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str()",
             "00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",pcVar3);
  std::__cxx11::string::~string((string *)&local_cc8);
  cfd::core::Script::~Script(&local_d00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ca8);
  if (!bVar2) {
    testing::Message::Message(&local_d08);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ca8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x319,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_d08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
    testing::Message::~Message(&local_d08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ca8);
  cfd::core::Amount::Amount((Amount *)local_d48,0x1dcd4b10);
  cfd::core::Address::GetLockingScript
            ((Script *)(local_da8 + 0x28),(Address *)((long)&in_path.field_2 + 8));
  cfd::core::Psbt::AddTxOut
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(Script *)(local_da8 + 0x28),
             (Amount *)local_d48);
  cfd::core::Script::~Script((Script *)(local_da8 + 0x28));
  local_1050 = &local_1048;
  cfd::core::KeyData::KeyData
            (local_1050,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_1050 = &local_ef8;
  cfd::core::KeyData::KeyData
            (local_1050,
             (KeyData *)
             &out_multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_da8._0_8_ = &local_1048;
  local_da8._8_8_ = (pointer)0x2;
  std::allocator<cfd::core::KeyData>::allocator
            ((allocator<cfd::core::KeyData> *)((long)&except_1 + 7));
  __l_00._M_len = local_da8._8_8_;
  __l_00._M_array = (iterator)local_da8._0_8_;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)(local_da8 + 0x10),
             __l_00,(allocator<cfd::core::KeyData> *)((long)&except_1 + 7));
  cfd::core::Psbt::SetTxOutData
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,(Script *)local_3d0,
             (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)(local_da8 + 0x10));
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)(local_da8 + 0x10));
  std::allocator<cfd::core::KeyData>::~allocator
            ((allocator<cfd::core::KeyData> *)((long)&except_1 + 7));
  local_1c20 = (KeyData *)local_da8;
  do {
    local_1c20 = local_1c20 + -1;
    cfd::core::KeyData::~KeyData(local_1c20);
  } while (local_1c20 != &local_1048);
  cfd::core::Psbt::Psbt((Psbt *)local_10d0);
  cfd::core::Psbt::AddTxIn((Psbt *)local_10d0,(TxIn *)local_a28);
  cfd::core::Transaction::GetTxOut
            ((TxOutReference *)&gtest_ar_5.message_,
             (Transaction *)
             ((long)&txin.super_AbstractTxIn.script_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data + 0x10),0);
  cfd::core::Psbt::SetTxInUtxo
            ((Psbt *)local_10d0,0,(TxOutReference *)&gtest_ar_5.message_,(Script *)local_8b0,
             (KeyData *)
             &key_in2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&gtest_ar_5.message_);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_1150,(Psbt *)local_10d0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1130,
             "\"cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAA\""
             ,"psbt1.GetBase64().c_str()",
             "cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAA"
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_1150);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1130);
  if (!bVar2) {
    testing::Message::Message(&local_1158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x32c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_2,&local_1158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_2);
    testing::Message::~Message(&local_1158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1130);
  cfd::core::Psbt::Psbt((Psbt *)local_11d8);
  cfd::core::Psbt::AddTxIn((Psbt *)local_11d8,(TxIn *)local_a28);
  cfd::core::Transaction::GetTxOut
            ((TxOutReference *)&gtest_ar_7.message_,
             (Transaction *)
             ((long)&txin.super_AbstractTxIn.script_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data + 0x10),0);
  cfd::core::Psbt::SetTxInUtxo
            ((Psbt *)local_11d8,0,(TxOutReference *)&gtest_ar_7.message_,(Script *)local_8b0,
             (KeyData *)
             &multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&gtest_ar_7.message_);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_1258,(Psbt *)local_11d8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1238,
             "\"cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAA\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAA"
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_1258);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1238);
  if (!bVar2) {
    testing::Message::Message(&local_1260);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x336,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_3,&local_1260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_3);
    testing::Message::~Message(&local_1260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1238);
  cfd::core::Psbt::Join
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(Psbt *)local_10d0,false);
  cfd::core::Psbt::Join
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(Psbt *)local_11d8,false);
  cfd::core::Psbt::GetData
            (&local_12d8,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_12c0,&local_12d8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_12a0,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_12c0);
  cfd::core::ByteData::~ByteData(&local_12d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12a0);
  if (!bVar2) {
    testing::Message::Message(&local_12e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_12a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x33f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_12e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_12e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12a0);
  cfd::core::Psbt::GetBase64_abi_cxx11_
            (&local_1318,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_12f8,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA="
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_1318);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12f8);
  if (!bVar2) {
    testing::Message::Message(&local_1320);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_12f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x340,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_4,&local_1320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_4);
    testing::Message::~Message(&local_1320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12f8);
  cfd::core::Psbt::operator=
            ((Psbt *)local_10d0,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetPrivkey
            ((Privkey *)&except_5,
             (KeyData *)
             &key_in2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::Sign((Psbt *)local_10d0,(Privkey *)&except_5,true);
  cfd::core::Privkey::~Privkey((Privkey *)&except_5);
  cfd::core::Psbt::operator=
            ((Psbt *)local_11d8,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxInSighashType
            ((Psbt *)((long)&utxo_txout.super_AbstractTxOut.locking_script_.script_stack_.
                             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                             ._M_impl.super__Vector_impl_data + 0x14),(int)&wallet1 + 0x10);
  cfd::core::Psbt::GetTxInUtxo
            ((TxOut *)&tx.vout_.
                       super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,false,(bool *)0x0);
  cfd::core::Psbt::GetTransaction
            ((Transaction *)
             &sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxInRedeemScript
            (&local_14a0,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,false,(bool *)0x0);
  cfd::core::Script::GetData(&local_1468,&local_14a0);
  cfd::core::SigHashType::SigHashType
            (&local_14ac,
             (SigHashType *)
             ((long)&utxo_txout.super_AbstractTxOut.locking_script_.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data + 0x14));
  AVar6 = cfd::core::AbstractTxOut::GetValue
                    ((AbstractTxOut *)
                     &tx.vout_.
                      super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar6.amount_;
  local_14c0.ignore_check_ = AVar6.ignore_check_;
  value = &local_14c0;
  local_14c0.amount_ =
       (int64_t)sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  cfd::core::Transaction::GetSignatureHash
            ((ByteData256 *)local_1450,
             (Transaction *)
             &sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,&local_1468,&local_14ac,value,
             kVersion0);
  cfd::core::ByteData::~ByteData(&local_1468);
  cfd::core::Script::~Script(&local_14a0);
  cfd::core::KeyData::GetPrivkey
            (&local_1508,
             (KeyData *)
             &multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Privkey::CalculateEcSignature
            ((ByteData *)local_14e8,&local_1508,(ByteData256 *)local_1450,true);
  cfd::core::Privkey::~Privkey(&local_1508);
  cfd::core::CryptoUtil::ConvertSignatureToDer
            ((ByteData *)&except_6,(ByteData *)local_14e8,
             (SigHashType *)
             ((long)&utxo_txout.super_AbstractTxOut.locking_script_.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data + 0x14));
  cfd::core::ByteData::operator=((ByteData *)local_14e8,(ByteData *)&except_6);
  cfd::core::ByteData::~ByteData((ByteData *)&except_6);
  cfd::core::Psbt::SetTxInSignature
            ((Psbt *)local_11d8,0,
             (KeyData *)
             &multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)local_14e8);
  cfd::core::ByteData::~ByteData((ByteData *)local_14e8);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_1450);
  cfd::core::Transaction::~Transaction
            ((Transaction *)
             &sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TxOut::~TxOut
            ((TxOut *)&tx.vout_.
                       super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::Combine
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(Psbt *)local_10d0);
  cfd::core::Psbt::Combine
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(Psbt *)local_11d8);
  cfd::core::Psbt::GetData
            (&local_1590,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1578,&local_1590);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1558,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_1578);
  cfd::core::ByteData::~ByteData(&local_1590);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1558);
  if (!bVar2) {
    testing::Message::Message(&local_1598);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x362,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_1598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_1598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1558);
  cfd::core::Psbt::GetBase64_abi_cxx11_
            (&local_15d0,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_15b0,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA"
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_15d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15b0);
  if (!bVar2) {
    testing::Message::Message(&local_15d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_15b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x363,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_7,&local_15d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_7);
    testing::Message::~Message(&local_15d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15b0);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &sig2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key_in2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxInSignature
            ((ByteData *)local_1620,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,
             (Pubkey *)
             &sig2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &sig2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxInSignature
            ((ByteData *)local_1650,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,
             (Pubkey *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxInRedeemScript
            ((Script *)&gtest_ar_.message_,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,false,(bool *)0x0);
  bVar2 = cfd::core::Psbt::IsFinalizedInput
                    ((Psbt *)&wallet1.seed_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_16b1 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_16b0,&local_16b1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16b0);
  if (!bVar2) {
    testing::Message::Message(&local_16c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_16b0,
               (AssertionResult *)"psbt.IsFinalizedInput(0)","true","false",(char *)value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x36d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_16c8,&local_16c0);
    testing::internal::AssertHelper::~AssertHelper(&local_16c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_16c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16b0);
  bVar2 = cfd::core::Psbt::IsFinalized
                    ((Psbt *)&wallet1.seed_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_16f9 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_16f8,&local_16f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16f8);
  if (!bVar2) {
    testing::Message::Message(&local_1708);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1730,(internal *)local_16f8,(AssertionResult *)"psbt.IsFinalized()","true",
               "false",(char *)value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x36e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1710,&local_1708);
    testing::internal::AssertHelper::~AssertHelper(&local_1710);
    std::__cxx11::string::~string((string *)&local_1730);
    testing::Message::~Message(&local_1708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16f8);
  cfd::core::ByteData::ByteData(&local_17b8);
  cfd::core::ByteData::ByteData(&local_17a0,(ByteData *)local_1620);
  cfd::core::ByteData::ByteData(&local_1788,(ByteData *)local_1650);
  cfd::core::Script::GetData(&local_1770,(Script *)&gtest_ar_.message_);
  local_1758._0_8_ = &local_17b8;
  local_1758._8_8_ = (pointer)0x4;
  this_00 = (allocator<cfd::core::ByteData> *)((long)&gtest_ar__2.message_.ptr_ + 7);
  std::allocator<cfd::core::ByteData>::allocator(this_00);
  __l._M_len = local_1758._8_8_;
  __l._M_array = (iterator)local_1758._0_8_;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             (local_1758 + 0x10),__l,this_00);
  cfd::core::Psbt::SetTxInFinalScript
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             (local_1758 + 0x10));
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             (local_1758 + 0x10));
  std::allocator<cfd::core::ByteData>::~allocator
            ((allocator<cfd::core::ByteData> *)((long)&gtest_ar__2.message_.ptr_ + 7));
  local_1d98 = (ByteData *)local_1758;
  do {
    local_1d98 = local_1d98 + -1;
    cfd::core::ByteData::~ByteData(local_1d98);
  } while (local_1d98 != &local_17b8);
  local_17d9 = cfd::core::Psbt::IsFinalizedInput
                         ((Psbt *)&wallet1.seed_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17d8,&local_17d9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17d8);
  if (!bVar2) {
    testing::Message::Message(&local_17e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &wit_script.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_17d8,
               (AssertionResult *)"psbt.IsFinalizedInput(0)","false","true",(char *)value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x372,pcVar3);
    testing::internal::AssertHelper::operator=(&local_17f0,&local_17e8);
    testing::internal::AssertHelper::~AssertHelper(&local_17f0);
    std::__cxx11::string::~string
              ((string *)
               &wit_script.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_17e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17d8);
  cfd::core::Psbt::ClearTxInSignData
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0);
  cfd::core::Psbt::GetTxInFinalScript
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &wsh_script.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,true);
  cfd::core::Psbt::GetTxInFinalScript
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_17.message_,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0,false);
  local_1854 = 4;
  local_1860 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          &wsh_script.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_1850,"4","wit_script.size()",&local_1854,&local_1860);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1850);
  if (!bVar2) {
    testing::Message::Message(&local_1868);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1850);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x377,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_1868);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_1868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1850);
  sVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &wsh_script.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar4 == 4) {
    cfd::core::Script::GetHex_abi_cxx11_(&local_18a0,(Script *)&gtest_ar_.message_);
    pvVar5 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        &wsh_script.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_18c0,pvVar5);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_1880,"script.GetHex()","wit_script[3].GetHex()",&local_18a0,
               &local_18c0);
    std::__cxx11::string::~string((string *)&local_18c0);
    std::__cxx11::string::~string((string *)&local_18a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1880);
    if (!bVar2) {
      testing::Message::Message(&local_18c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1880);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x379,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_18c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
      testing::Message::~Message(&local_18c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1880);
  }
  local_18e4 = 1;
  local_18f0 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          &gtest_ar_17.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_18e0,"1","wsh_script.size()",&local_18e4,&local_18f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18e0);
  if (!bVar2) {
    testing::Message::Message(&local_18f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_18e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &exp_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x37b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &exp_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_18f8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &exp_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_18f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18e0);
  sVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &gtest_ar_17.message_);
  if (sVar4 == 1) {
    cfd::core::ScriptUtil::CreateP2wshLockingScript
              ((Script *)&gtest_ar_20.message_,(Script *)&gtest_ar_.message_);
    cfd::core::Script::GetData(&local_1998,(Script *)&gtest_ar_20.message_);
    cfd::core::ByteData::Serialize(&local_1980,&local_1998);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1968,&local_1980);
    pvVar5 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        &gtest_ar_17.message_,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_19b8,pvVar5);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_1948,"exp_script.GetData().Serialize().GetHex()",
               "wsh_script[0].GetHex()",&local_1968,&local_19b8);
    std::__cxx11::string::~string((string *)&local_19b8);
    std::__cxx11::string::~string((string *)&local_1968);
    cfd::core::ByteData::~ByteData(&local_1980);
    cfd::core::ByteData::~ByteData(&local_1998);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1948);
    if (!bVar2) {
      testing::Message::Message(&local_19c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1948);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x37e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_19c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
      testing::Message::~Message(&local_19c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1948);
    cfd::core::Script::~Script((Script *)&gtest_ar_20.message_);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_
            (&local_19f8,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_19d8,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQcjIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBCNoEAEcwRAIgIGNZN+BRcNg9wyE62zpurmZxMAjkq8OLSRLFaA3sTwwCIDPAinGjB1ewhGPVMOwFjtdAGWj7ML72PUVJchoOSFuEAUcwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSrgABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQcjIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBCNoEAEcwRAIgIGNZN+BRcNg9wyE62zpurmZxMAjkq8OLSRLFaA3sTwwCIDPAinGjB1ewhGPVMOwFjtdAGWj7ML72PUVJchoOSFuEAUcwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSrgABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA="
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_19f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19d8);
  if (!bVar2) {
    testing::Message::Message(&local_1a00);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_19d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x380,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_8,&local_1a00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_8);
    testing::Message::~Message(&local_1a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19d8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_17.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &wsh_script.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script((Script *)&gtest_ar_.message_);
  cfd::core::ByteData::~ByteData((ByteData *)local_1650);
  cfd::core::ByteData::~ByteData((ByteData *)local_1620);
  local_1a41 = cfd::core::Psbt::IsFinalized
                         ((Psbt *)&wallet1.seed_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a40,&local_1a41,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a40);
  if (!bVar2) {
    testing::Message::Message(&local_1a50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &tx_1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1a40,
               (AssertionResult *)"psbt.IsFinalized()","false","true",(char *)value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x387,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a58,&local_1a50);
    testing::internal::AssertHelper::~AssertHelper(&local_1a58);
    std::__cxx11::string::~string
              ((string *)
               &tx_1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1a50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a40);
  cfd::core::Psbt::ExtractTransaction
            ((Transaction *)&gtest_ar_23.message_,
             (Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_1ae8,(AbstractTransaction *)&gtest_ar_23.message_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1ac8,
             "\"02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000\""
             ,"tx.GetHex().c_str()",
             "02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000"
             ,pcVar3);
  std::__cxx11::string::~string((string *)&local_1ae8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ac8);
  if (!bVar2) {
    testing::Message::Message(&local_1af0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1ac8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_9,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x389,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_9,&local_1af0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_9);
    testing::Message::~Message(&local_1af0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ac8);
  cfd::core::Transaction::~Transaction((Transaction *)&gtest_ar_23.message_);
  cfd::core::Psbt::~Psbt((Psbt *)local_11d8);
  cfd::core::Psbt::~Psbt((Psbt *)local_10d0);
  cfd::core::TxIn::~TxIn((TxIn *)local_a28);
  cfd::core::Transaction::~Transaction
            ((Transaction *)
             ((long)&txin.super_AbstractTxIn.script_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data + 0x10));
  cfd::core::Script::~Script((Script *)local_8b0);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &key_in2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_5d0);
  cfd::core::Address::~Address((Address *)((long)&in_path.field_2 + 8));
  cfd::core::Script::~Script((Script *)local_3d0);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &out_multisig.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_f0);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_b8);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_78);
  cfd::core::Psbt::~Psbt
            ((Psbt *)&wallet1.seed_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Psbt, UsecaseMultisig) {
  Psbt psbt;
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/12";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path1);
  auto out_multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key1.GetPubkey(), key2.GetPubkey()});
  auto addr = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_multisig);

  std::string in_path = "44h/0h/0h/0/11";
  auto key_in1 = wallet1.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto key_in2 = wallet2.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key_in1.GetPubkey(), key_in2.GetPubkey()});
  EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae", multisig.GetHex().c_str());

  Transaction utxo_tx(g_psbt_utxo_sh_wsh_multi);
  TxIn txin(Txid("544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"), 0, 0xffffffff);

  try {
    psbt.AddTxIn(txin);
    psbt.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, KeyData());
    psbt.SetTxInSighashType(0, SigHashType());
    EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae",
        psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str());
    EXPECT_STREQ("00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",
        psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Amount amount(499993360);
  try {
    psbt.AddTxOut(addr.GetLockingScript(), amount);
    psbt.SetTxOutData(0, out_multisig, std::vector<KeyData>{key1, key2});
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt1;
  try {
    psbt1.AddTxIn(txin);
    psbt1.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in1);
    EXPECT_STREQ("cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAA", psbt1.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt2;
  try {
    psbt2.AddTxIn(txin);
    psbt2.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in2);
    EXPECT_STREQ("cHNidP8BADMCAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////AAAAAAAAAQEgCFjNHQAAAAAXqRSUX7UDkacGN8H/xat/tlMIwvIxdYcBBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAA", psbt2.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Join(psbt1);
    psbt.Join(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt1 = psbt;
    psbt1.Sign(key_in1.GetPrivkey());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt2 = psbt;
    // psbt2.Sign(key_in2.GetPrivkey());
    // Same processing.
    auto sighash_type = psbt.GetTxInSighashType(0);
    auto utxo_txout = psbt.GetTxInUtxo(0);
    auto tx = psbt.GetTransaction();
    auto sighash = tx.GetSignatureHash(0, psbt.GetTxInRedeemScript(0).GetData(),
        sighash_type, utxo_txout.GetValue(), WitnessVersion::kVersion0);
    auto sig = key_in2.GetPrivkey().CalculateEcSignature(sighash);
    sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
    psbt2.SetTxInSignature(0, key_in2, sig);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Combine(psbt1);
    psbt.Combine(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    auto sig1 = psbt.GetTxInSignature(0, key_in1.GetPubkey());
    auto sig2 = psbt.GetTxInSignature(0, key_in2.GetPubkey());
    auto script = psbt.GetTxInRedeemScript(0);
    EXPECT_FALSE(psbt.IsFinalizedInput(0));
    EXPECT_FALSE(psbt.IsFinalized());
    psbt.SetTxInFinalScript(
        0, std::vector<ByteData>{ByteData(), sig1, sig2, script.GetData()});
    // psbt.Finalize();
    EXPECT_TRUE(psbt.IsFinalizedInput(0));
    psbt.ClearTxInSignData(0);

    auto wit_script = psbt.GetTxInFinalScript(0, true);
    auto wsh_script = psbt.GetTxInFinalScript(0, false);
    EXPECT_EQ(4, wit_script.size());
    if (4 == wit_script.size()) {
      EXPECT_EQ(script.GetHex(), wit_script[3].GetHex());
    }
    EXPECT_EQ(1, wsh_script.size());
    if (1 == wsh_script.size()) {
      auto exp_script = ScriptUtil::CreateP2wshLockingScript(script);
      EXPECT_EQ(exp_script.GetData().Serialize().GetHex(), wsh_script[0].GetHex());
    }
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQcjIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBCNoEAEcwRAIgIGNZN+BRcNg9wyE62zpurmZxMAjkq8OLSRLFaA3sTwwCIDPAinGjB1ewhGPVMOwFjtdAGWj7ML72PUVJchoOSFuEAUcwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSrgABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    EXPECT_TRUE(psbt.IsFinalized());
    auto tx = psbt.ExtractTransaction();
    EXPECT_STREQ("02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000", tx.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
}